

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::QuadMvIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  BVH *bvh;
  Geometry *pGVar1;
  RTCRayQueryContext *pRVar2;
  RTCFilterFunctionN p_Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  ulong uVar13;
  ulong uVar14;
  size_t k;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  ulong uVar36;
  byte bVar37;
  bool bVar38;
  int iVar39;
  long lVar40;
  long lVar41;
  byte bVar42;
  size_t i_1;
  long lVar43;
  byte bVar44;
  undefined1 (*pauVar45) [32];
  NodeRef root;
  undefined4 uVar46;
  ulong *puVar47;
  uint uVar48;
  ulong uVar49;
  undefined1 auVar50 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  vfloat_impl<8> vVar72;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  float fVar75;
  float fVar76;
  undefined1 auVar78 [36];
  undefined1 auVar77 [64];
  undefined1 extraout_var [36];
  undefined1 extraout_var_00 [36];
  float fVar80;
  undefined1 auVar81 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar83 [36];
  undefined1 auVar82 [64];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  uint uVar113;
  uint uVar114;
  uint uVar115;
  undefined1 in_ZMM12 [64];
  undefined1 auVar116 [64];
  undefined1 in_ZMM13 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 in_ZMM14 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [32];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 in_ZMM22 [64];
  undefined1 auVar126 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vfloat<8> t;
  vfloat<8> v;
  vfloat<8> u;
  Vec3vf<8> Ng;
  TravRayK<8,_false> tray;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  uint local_2c8c;
  Precalculations local_2c51;
  RTCFilterFunctionNArguments local_2c50;
  Geometry *local_2c20;
  RayK<8> *local_2c18;
  ulong local_2c10;
  undefined4 local_2c08;
  undefined4 local_2c04;
  undefined1 local_2c00 [8];
  int iStack_2bf8;
  int iStack_2bf4;
  int iStack_2bf0;
  int iStack_2bec;
  int iStack_2be8;
  int iStack_2be4;
  undefined1 (*local_2bc8) [32];
  undefined1 local_2bc0 [32];
  undefined1 local_2ba0 [32];
  Intersectors *local_2b68;
  undefined1 local_2b60 [32];
  undefined8 local_2b30;
  undefined8 uStack_2b28;
  undefined1 local_2b20 [32];
  undefined1 local_2b00 [32];
  undefined1 local_2ae0 [32];
  undefined1 local_2ac0 [32];
  undefined1 local_2aa0 [32];
  undefined1 local_2a80 [32];
  undefined1 local_2a60 [32];
  undefined1 local_2a40 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_2a20;
  RTCRayQueryContext local_2a00 [4];
  RTCRayN local_29e0 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_29c0;
  undefined1 local_2960 [8];
  float fStack_2958;
  float fStack_2954;
  float fStack_2950;
  float fStack_294c;
  float fStack_2948;
  uint uStack_2944;
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  uint local_28e0;
  uint uStack_28dc;
  uint uStack_28d8;
  uint uStack_28d4;
  uint uStack_28d0;
  uint uStack_28cc;
  uint uStack_28c8;
  uint uStack_28c4;
  uint local_28c0;
  uint uStack_28bc;
  uint uStack_28b8;
  uint uStack_28b4;
  uint uStack_28b0;
  uint uStack_28ac;
  uint uStack_28a8;
  uint uStack_28a4;
  int local_28a0 [8];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_2880;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_2860;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2840;
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  float local_2720;
  float fStack_271c;
  float fStack_2718;
  float fStack_2714;
  float fStack_2710;
  float fStack_270c;
  float fStack_2708;
  undefined4 uStack_2704;
  float local_2700;
  float fStack_26fc;
  float fStack_26f8;
  float fStack_26f4;
  float fStack_26f0;
  float fStack_26ec;
  float fStack_26e8;
  undefined4 uStack_26e4;
  undefined1 local_26e0 [32];
  int local_26c0;
  int iStack_26bc;
  int iStack_26b8;
  int iStack_26b4;
  int iStack_26b0;
  int iStack_26ac;
  int iStack_26a8;
  int iStack_26a4;
  uint local_26a0;
  uint uStack_269c;
  uint uStack_2698;
  uint uStack_2694;
  uint uStack_2690;
  uint uStack_268c;
  uint uStack_2688;
  uint uStack_2684;
  uint local_2680;
  uint uStack_267c;
  uint uStack_2678;
  uint uStack_2674;
  uint uStack_2670;
  uint uStack_266c;
  uint uStack_2668;
  uint uStack_2664;
  uint local_2660;
  uint uStack_265c;
  uint uStack_2658;
  uint uStack_2654;
  uint uStack_2650;
  uint uStack_264c;
  uint uStack_2648;
  uint uStack_2644;
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  uint local_1e60;
  uint uStack_1e5c;
  uint uStack_1e58;
  uint uStack_1e54;
  uint uStack_1e50;
  uint uStack_1e4c;
  uint uStack_1e48;
  uint uStack_1e44;
  undefined1 local_1e40 [7696];
  undefined1 auVar79 [36];
  undefined1 auVar84 [36];
  undefined1 auVar105 [32];
  undefined1 auVar110 [32];
  
  bvh = (BVH *)This->ptr;
  local_2608 = (bvh->root).ptr;
  if (local_2608 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar53 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar50 = ZEXT816(0) << 0x40;
      uVar49 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar50),5);
      uVar13 = vpcmpeqd_avx512vl(auVar53,(undefined1  [32])valid_i->field_0);
      uVar49 = uVar49 & uVar13;
      bVar42 = (byte)uVar49;
      if (bVar42 != 0) {
        local_2840._0_4_ = *(float *)ray;
        local_2840._4_4_ = *(float *)(ray + 4);
        local_2840._8_4_ = *(float *)(ray + 8);
        local_2840._12_4_ = *(float *)(ray + 0xc);
        local_2840._16_4_ = *(float *)(ray + 0x10);
        local_2840._20_4_ = *(float *)(ray + 0x14);
        local_2840._24_4_ = *(float *)(ray + 0x18);
        local_2840._28_4_ = *(undefined4 *)(ray + 0x1c);
        local_2840._32_4_ = *(float *)(ray + 0x20);
        local_2840._36_4_ = *(float *)(ray + 0x24);
        local_2840._40_4_ = *(float *)(ray + 0x28);
        local_2840._44_4_ = *(float *)(ray + 0x2c);
        local_2840._48_4_ = *(float *)(ray + 0x30);
        local_2840._52_4_ = *(float *)(ray + 0x34);
        local_2840._56_4_ = *(float *)(ray + 0x38);
        local_2840._60_4_ = *(undefined4 *)(ray + 0x3c);
        local_2840._64_4_ = *(float *)(ray + 0x40);
        local_2840._68_4_ = *(float *)(ray + 0x44);
        local_2840._72_4_ = *(float *)(ray + 0x48);
        local_2840._76_4_ = *(float *)(ray + 0x4c);
        local_2840._80_4_ = *(float *)(ray + 0x50);
        local_2840._84_4_ = *(float *)(ray + 0x54);
        local_2840._88_4_ = *(float *)(ray + 0x58);
        local_2840._92_4_ = *(undefined4 *)(ray + 0x5c);
        local_27e0 = *(undefined1 (*) [32])(ray + 0x80);
        local_27c0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_27a0 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar122 = ZEXT3264(auVar53);
        vandps_avx512vl(local_27e0,auVar53);
        auVar54._8_4_ = 0x219392ef;
        auVar54._0_8_ = 0x219392ef219392ef;
        auVar54._12_4_ = 0x219392ef;
        auVar54._16_4_ = 0x219392ef;
        auVar54._20_4_ = 0x219392ef;
        auVar54._24_4_ = 0x219392ef;
        auVar54._28_4_ = 0x219392ef;
        uVar13 = vcmpps_avx512vl(auVar53,auVar54,1);
        bVar38 = (bool)((byte)uVar13 & 1);
        auVar55._0_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_27e0._0_4_;
        bVar38 = (bool)((byte)(uVar13 >> 1) & 1);
        auVar55._4_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_27e0._4_4_;
        bVar38 = (bool)((byte)(uVar13 >> 2) & 1);
        auVar55._8_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_27e0._8_4_;
        bVar38 = (bool)((byte)(uVar13 >> 3) & 1);
        auVar55._12_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_27e0._12_4_;
        bVar38 = (bool)((byte)(uVar13 >> 4) & 1);
        auVar55._16_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_27e0._16_4_;
        bVar38 = (bool)((byte)(uVar13 >> 5) & 1);
        auVar55._20_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_27e0._20_4_;
        bVar38 = (bool)((byte)(uVar13 >> 6) & 1);
        auVar55._24_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_27e0._24_4_;
        bVar38 = SUB81(uVar13 >> 7,0);
        auVar55._28_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_27e0._28_4_;
        vandps_avx512vl(local_27c0,auVar53);
        uVar13 = vcmpps_avx512vl(auVar55,auVar54,1);
        bVar38 = (bool)((byte)uVar13 & 1);
        auVar73._0_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_27c0._0_4_;
        bVar38 = (bool)((byte)(uVar13 >> 1) & 1);
        auVar73._4_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_27c0._4_4_;
        bVar38 = (bool)((byte)(uVar13 >> 2) & 1);
        auVar73._8_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_27c0._8_4_;
        bVar38 = (bool)((byte)(uVar13 >> 3) & 1);
        auVar73._12_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_27c0._12_4_;
        bVar38 = (bool)((byte)(uVar13 >> 4) & 1);
        auVar73._16_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_27c0._16_4_;
        bVar38 = (bool)((byte)(uVar13 >> 5) & 1);
        auVar73._20_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_27c0._20_4_;
        bVar38 = (bool)((byte)(uVar13 >> 6) & 1);
        auVar73._24_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_27c0._24_4_;
        bVar38 = SUB81(uVar13 >> 7,0);
        auVar73._28_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_27c0._28_4_;
        vandps_avx512vl(local_27a0,auVar53);
        uVar13 = vcmpps_avx512vl(auVar73,auVar54,1);
        bVar38 = (bool)((byte)uVar13 & 1);
        auVar53._0_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_27a0._0_4_;
        bVar38 = (bool)((byte)(uVar13 >> 1) & 1);
        auVar53._4_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_27a0._4_4_;
        bVar38 = (bool)((byte)(uVar13 >> 2) & 1);
        auVar53._8_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_27a0._8_4_;
        bVar38 = (bool)((byte)(uVar13 >> 3) & 1);
        auVar53._12_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_27a0._12_4_;
        bVar38 = (bool)((byte)(uVar13 >> 4) & 1);
        auVar53._16_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_27a0._16_4_;
        bVar38 = (bool)((byte)(uVar13 >> 5) & 1);
        auVar53._20_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_27a0._20_4_;
        bVar38 = (bool)((byte)(uVar13 >> 6) & 1);
        auVar53._24_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_27a0._24_4_;
        bVar38 = SUB81(uVar13 >> 7,0);
        auVar53._28_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * local_27a0._28_4_;
        auVar56._8_4_ = 0x3f800000;
        auVar56._0_8_ = 0x3f8000003f800000;
        auVar56._12_4_ = 0x3f800000;
        auVar56._16_4_ = 0x3f800000;
        auVar56._20_4_ = 0x3f800000;
        auVar56._24_4_ = 0x3f800000;
        auVar56._28_4_ = 0x3f800000;
        auVar54 = vrcp14ps_avx512vl(auVar55);
        auVar51 = vfnmadd213ps_fma(auVar55,auVar54,auVar56);
        auVar51 = vfmadd132ps_fma(ZEXT1632(auVar51),auVar54,auVar54);
        auVar55 = vrcp14ps_avx512vl(auVar73);
        auVar52 = vfnmadd213ps_fma(auVar73,auVar55,auVar56);
        auVar52 = vfmadd132ps_fma(ZEXT1632(auVar52),auVar55,auVar55);
        auVar55 = vrcp14ps_avx512vl(auVar53);
        auVar104 = vfnmadd213ps_fma(auVar53,auVar55,auVar56);
        local_2780 = ZEXT1632(auVar51);
        local_2760 = ZEXT1632(auVar52);
        auVar104 = vfmadd132ps_fma(ZEXT1632(auVar104),auVar55,auVar55);
        local_2740 = ZEXT1632(auVar104);
        local_26e0._4_4_ = *(float *)(ray + 0x44) * auVar104._4_4_;
        local_26e0._0_4_ = *(float *)(ray + 0x40) * auVar104._0_4_;
        local_26e0._8_4_ = *(float *)(ray + 0x48) * auVar104._8_4_;
        local_26e0._12_4_ = *(float *)(ray + 0x4c) * auVar104._12_4_;
        local_26e0._16_4_ = *(float *)(ray + 0x50) * 0.0;
        local_26e0._20_4_ = *(float *)(ray + 0x54) * 0.0;
        local_26e0._24_4_ = *(float *)(ray + 0x58) * 0.0;
        local_26e0._28_4_ = *(undefined4 *)(ray + 0x5c);
        local_2720 = *(float *)ray * auVar51._0_4_;
        fStack_271c = *(float *)(ray + 4) * auVar51._4_4_;
        fStack_2718 = *(float *)(ray + 8) * auVar51._8_4_;
        fStack_2714 = *(float *)(ray + 0xc) * auVar51._12_4_;
        fStack_2710 = *(float *)(ray + 0x10) * 0.0;
        fStack_270c = *(float *)(ray + 0x14) * 0.0;
        fStack_2708 = *(float *)(ray + 0x18) * 0.0;
        uStack_2704 = *(undefined4 *)(ray + 0x1c);
        local_2700 = *(float *)(ray + 0x20) * auVar52._0_4_;
        fStack_26fc = *(float *)(ray + 0x24) * auVar52._4_4_;
        fStack_26f8 = *(float *)(ray + 0x28) * auVar52._8_4_;
        fStack_26f4 = *(float *)(ray + 0x2c) * auVar52._12_4_;
        fStack_26f0 = *(float *)(ray + 0x30) * 0.0;
        fStack_26ec = *(float *)(ray + 0x34) * 0.0;
        fStack_26e8 = *(float *)(ray + 0x38) * 0.0;
        uStack_26e4 = *(undefined4 *)(ray + 0x3c);
        uVar13 = vcmpps_avx512vl(ZEXT1632(auVar51),ZEXT1632(auVar50),1);
        auVar53 = vpbroadcastd_avx512vl(ZEXT416(0x10));
        local_26c0 = (uint)((byte)uVar13 & 1) * auVar53._0_4_;
        iStack_26bc = (uint)((byte)(uVar13 >> 1) & 1) * auVar53._4_4_;
        iStack_26b8 = (uint)((byte)(uVar13 >> 2) & 1) * auVar53._8_4_;
        iStack_26b4 = (uint)((byte)(uVar13 >> 3) & 1) * auVar53._12_4_;
        iStack_26b0 = (uint)((byte)(uVar13 >> 4) & 1) * auVar53._16_4_;
        iStack_26ac = (uint)((byte)(uVar13 >> 5) & 1) * auVar53._20_4_;
        iStack_26a8 = (uint)((byte)(uVar13 >> 6) & 1) * auVar53._24_4_;
        iStack_26a4 = (uint)(byte)(uVar13 >> 7) * auVar53._28_4_;
        auVar55 = ZEXT1632(auVar50);
        uVar13 = vcmpps_avx512vl(ZEXT1632(auVar52),auVar55,5);
        auVar53 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        bVar38 = (bool)((byte)uVar13 & 1);
        bVar4 = (bool)((byte)(uVar13 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar13 >> 2) & 1);
        bVar6 = (bool)((byte)(uVar13 >> 3) & 1);
        bVar7 = (bool)((byte)(uVar13 >> 4) & 1);
        bVar8 = (bool)((byte)(uVar13 >> 5) & 1);
        bVar9 = (bool)((byte)(uVar13 >> 6) & 1);
        bVar10 = SUB81(uVar13 >> 7,0);
        local_26a0 = (uint)bVar38 * auVar53._0_4_ | (uint)!bVar38 * 0x30;
        uStack_269c = (uint)bVar4 * auVar53._4_4_ | (uint)!bVar4 * 0x30;
        uStack_2698 = (uint)bVar5 * auVar53._8_4_ | (uint)!bVar5 * 0x30;
        uStack_2694 = (uint)bVar6 * auVar53._12_4_ | (uint)!bVar6 * 0x30;
        uStack_2690 = (uint)bVar7 * auVar53._16_4_ | (uint)!bVar7 * 0x30;
        uStack_268c = (uint)bVar8 * auVar53._20_4_ | (uint)!bVar8 * 0x30;
        uStack_2688 = (uint)bVar9 * auVar53._24_4_ | (uint)!bVar9 * 0x30;
        uStack_2684 = (uint)bVar10 * auVar53._28_4_ | (uint)!bVar10 * 0x30;
        uVar13 = vcmpps_avx512vl(ZEXT1632(auVar104),auVar55,5);
        auVar53 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar38 = (bool)((byte)uVar13 & 1);
        bVar4 = (bool)((byte)(uVar13 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar13 >> 2) & 1);
        bVar6 = (bool)((byte)(uVar13 >> 3) & 1);
        bVar7 = (bool)((byte)(uVar13 >> 4) & 1);
        bVar8 = (bool)((byte)(uVar13 >> 5) & 1);
        bVar9 = (bool)((byte)(uVar13 >> 6) & 1);
        bVar10 = SUB81(uVar13 >> 7,0);
        local_2680 = (uint)bVar38 * auVar53._0_4_ | (uint)!bVar38 * 0x50;
        uStack_267c = (uint)bVar4 * auVar53._4_4_ | (uint)!bVar4 * 0x50;
        uStack_2678 = (uint)bVar5 * auVar53._8_4_ | (uint)!bVar5 * 0x50;
        uStack_2674 = (uint)bVar6 * auVar53._12_4_ | (uint)!bVar6 * 0x50;
        uStack_2670 = (uint)bVar7 * auVar53._16_4_ | (uint)!bVar7 * 0x50;
        uStack_266c = (uint)bVar8 * auVar53._20_4_ | (uint)!bVar8 * 0x50;
        uStack_2668 = (uint)bVar9 * auVar53._24_4_ | (uint)!bVar9 * 0x50;
        uStack_2664 = (uint)bVar10 * auVar53._28_4_ | (uint)!bVar10 * 0x50;
        local_1e80 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar124 = ZEXT3264(local_1e80);
        auVar53 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar55);
        local_2660 = (uint)(bVar42 & 1) * auVar53._0_4_ |
                     (uint)!(bool)(bVar42 & 1) * local_1e80._0_4_;
        bVar38 = (bool)((byte)(uVar49 >> 1) & 1);
        uStack_265c = (uint)bVar38 * auVar53._4_4_ | (uint)!bVar38 * local_1e80._4_4_;
        bVar38 = (bool)((byte)(uVar49 >> 2) & 1);
        uStack_2658 = (uint)bVar38 * auVar53._8_4_ | (uint)!bVar38 * local_1e80._8_4_;
        bVar38 = (bool)((byte)(uVar49 >> 3) & 1);
        uStack_2654 = (uint)bVar38 * auVar53._12_4_ | (uint)!bVar38 * local_1e80._12_4_;
        bVar38 = (bool)((byte)(uVar49 >> 4) & 1);
        uStack_2650 = (uint)bVar38 * auVar53._16_4_ | (uint)!bVar38 * local_1e80._16_4_;
        bVar38 = (bool)((byte)(uVar49 >> 5) & 1);
        uStack_264c = (uint)bVar38 * auVar53._20_4_ | (uint)!bVar38 * local_1e80._20_4_;
        bVar38 = (bool)((byte)(uVar49 >> 6) & 1);
        uStack_2648 = (uint)bVar38 * auVar53._24_4_ | (uint)!bVar38 * local_1e80._24_4_;
        bVar38 = SUB81(uVar49 >> 7,0);
        uStack_2644 = (uint)bVar38 * auVar53._28_4_ | (uint)!bVar38 * local_1e80._28_4_;
        auVar53 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar123 = ZEXT3264(auVar53);
        local_2c04 = (undefined4)uVar49;
        auVar55 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar55);
        local_2640._0_4_ =
             (uint)(bVar42 & 1) * auVar55._0_4_ | (uint)!(bool)(bVar42 & 1) * auVar53._0_4_;
        bVar38 = (bool)((byte)(uVar49 >> 1) & 1);
        local_2640._4_4_ = (uint)bVar38 * auVar55._4_4_ | (uint)!bVar38 * auVar53._4_4_;
        bVar38 = (bool)((byte)(uVar49 >> 2) & 1);
        local_2640._8_4_ = (uint)bVar38 * auVar55._8_4_ | (uint)!bVar38 * auVar53._8_4_;
        bVar38 = (bool)((byte)(uVar49 >> 3) & 1);
        local_2640._12_4_ = (uint)bVar38 * auVar55._12_4_ | (uint)!bVar38 * auVar53._12_4_;
        bVar38 = (bool)((byte)(uVar49 >> 4) & 1);
        local_2640._16_4_ = (uint)bVar38 * auVar55._16_4_ | (uint)!bVar38 * auVar53._16_4_;
        bVar38 = (bool)((byte)(uVar49 >> 5) & 1);
        local_2640._20_4_ = (uint)bVar38 * auVar55._20_4_ | (uint)!bVar38 * auVar53._20_4_;
        bVar38 = (bool)((byte)(uVar49 >> 6) & 1);
        local_2640._24_4_ = (uint)bVar38 * auVar55._24_4_ | (uint)!bVar38 * auVar53._24_4_;
        bVar38 = SUB81(uVar49 >> 7,0);
        local_2640._28_4_ = (uint)bVar38 * auVar55._28_4_ | (uint)!bVar38 * auVar53._28_4_;
        local_2c8c = (uint)(byte)~bVar42;
        if (context->user == (RTCRayQueryContext *)0x0) {
          local_2c10 = 5;
        }
        else {
          local_2c10 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                              RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
        }
        local_2c18 = ray + 0x100;
        puVar47 = local_2600;
        local_2610 = 0xfffffffffffffff8;
        pauVar45 = (undefined1 (*) [32])local_1e40;
        local_1e60 = local_2660;
        uStack_1e5c = uStack_265c;
        uStack_1e58 = uStack_2658;
        uStack_1e54 = uStack_2654;
        uStack_1e50 = uStack_2650;
        uStack_1e4c = uStack_264c;
        uStack_1e48 = uStack_2648;
        uStack_1e44 = uStack_2644;
        local_2bc8 = (undefined1 (*) [32])&local_28e0;
        auVar53 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar125 = ZEXT3264(auVar53);
        auVar50 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
        auVar126 = ZEXT1664(auVar50);
        local_2b68 = This;
LAB_01d02df5:
        do {
          auVar53 = auVar123._0_32_;
          do {
            root.ptr = puVar47[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_01d03d61;
            puVar47 = puVar47 + -1;
            auVar55 = pauVar45[-1];
            pauVar45 = pauVar45 + -1;
            uVar49 = vcmpps_avx512vl(auVar55,local_2640,1);
          } while ((char)uVar49 == '\0');
          uVar46 = (undefined4)uVar49;
          if (local_2c10 < (uint)POPCOUNT(uVar46)) {
LAB_01d02e49:
            auVar53 = auVar123._0_32_;
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_01d03d61;
                uVar11 = vcmpps_avx512vl(auVar55,local_2640,9);
                if ((char)uVar11 == '\0') goto LAB_01d02df5;
                bVar42 = ~(byte)local_2c8c;
                lVar41 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
                lVar40 = 0;
                goto LAB_01d03000;
              }
              uVar49 = 8;
              auVar55 = auVar124._0_32_;
              for (lVar41 = 0;
                  (lVar41 != 4 &&
                  (uVar13 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar41 * 8), uVar13 != 8));
                  lVar41 = lVar41 + 1) {
                auVar32._4_4_ = fStack_271c;
                auVar32._0_4_ = local_2720;
                auVar32._8_4_ = fStack_2718;
                auVar32._12_4_ = fStack_2714;
                auVar32._16_4_ = fStack_2710;
                auVar32._20_4_ = fStack_270c;
                auVar32._24_4_ = fStack_2708;
                auVar32._28_4_ = uStack_2704;
                uVar46 = *(undefined4 *)(root.ptr + 0x20 + lVar41 * 4);
                auVar86._4_4_ = uVar46;
                auVar86._0_4_ = uVar46;
                auVar86._8_4_ = uVar46;
                auVar86._12_4_ = uVar46;
                auVar86._16_4_ = uVar46;
                auVar86._20_4_ = uVar46;
                auVar86._24_4_ = uVar46;
                auVar86._28_4_ = uVar46;
                auVar50 = vfmsub132ps_fma(auVar86,auVar32,local_2780);
                auVar33._4_4_ = fStack_26fc;
                auVar33._0_4_ = local_2700;
                auVar33._8_4_ = fStack_26f8;
                auVar33._12_4_ = fStack_26f4;
                auVar33._16_4_ = fStack_26f0;
                auVar33._20_4_ = fStack_26ec;
                auVar33._24_4_ = fStack_26e8;
                auVar33._28_4_ = uStack_26e4;
                uVar46 = *(undefined4 *)(root.ptr + 0x40 + lVar41 * 4);
                auVar101._4_4_ = uVar46;
                auVar101._0_4_ = uVar46;
                auVar101._8_4_ = uVar46;
                auVar101._12_4_ = uVar46;
                auVar101._16_4_ = uVar46;
                auVar101._20_4_ = uVar46;
                auVar101._24_4_ = uVar46;
                auVar101._28_4_ = uVar46;
                uVar46 = *(undefined4 *)(root.ptr + 0x60 + lVar41 * 4);
                auVar109._4_4_ = uVar46;
                auVar109._0_4_ = uVar46;
                auVar109._8_4_ = uVar46;
                auVar109._12_4_ = uVar46;
                auVar109._16_4_ = uVar46;
                auVar109._20_4_ = uVar46;
                auVar109._24_4_ = uVar46;
                auVar109._28_4_ = uVar46;
                auVar51 = vfmsub132ps_fma(auVar101,auVar33,local_2760);
                auVar52 = vfmsub132ps_fma(auVar109,local_26e0,local_2740);
                uVar46 = *(undefined4 *)(root.ptr + 0x30 + lVar41 * 4);
                auVar17._4_4_ = uVar46;
                auVar17._0_4_ = uVar46;
                auVar17._8_4_ = uVar46;
                auVar17._12_4_ = uVar46;
                auVar17._16_4_ = uVar46;
                auVar17._20_4_ = uVar46;
                auVar17._24_4_ = uVar46;
                auVar17._28_4_ = uVar46;
                auVar56 = vfmsub132ps_avx512vl(local_2780,auVar32,auVar17);
                uVar46 = *(undefined4 *)(root.ptr + 0x50 + lVar41 * 4);
                auVar18._4_4_ = uVar46;
                auVar18._0_4_ = uVar46;
                auVar18._8_4_ = uVar46;
                auVar18._12_4_ = uVar46;
                auVar18._16_4_ = uVar46;
                auVar18._20_4_ = uVar46;
                auVar18._24_4_ = uVar46;
                auVar18._28_4_ = uVar46;
                auVar57 = vfmsub132ps_avx512vl(local_2760,auVar33,auVar18);
                uVar46 = *(undefined4 *)(root.ptr + 0x70 + lVar41 * 4);
                auVar19._4_4_ = uVar46;
                auVar19._0_4_ = uVar46;
                auVar19._8_4_ = uVar46;
                auVar19._12_4_ = uVar46;
                auVar19._16_4_ = uVar46;
                auVar19._20_4_ = uVar46;
                auVar19._24_4_ = uVar46;
                auVar19._28_4_ = uVar46;
                auVar58 = vfmsub132ps_avx512vl(local_2740,local_26e0,auVar19);
                auVar73 = vpminsd_avx2(ZEXT1632(auVar50),auVar56);
                auVar54 = vpminsd_avx2(ZEXT1632(auVar51),auVar57);
                auVar73 = vpmaxsd_avx2(auVar73,auVar54);
                auVar54 = vpminsd_avx2(ZEXT1632(auVar52),auVar58);
                auVar73 = vpmaxsd_avx2(auVar73,auVar54);
                auVar54 = vpmaxsd_avx2(ZEXT1632(auVar50),auVar56);
                auVar56 = vpmaxsd_avx2(ZEXT1632(auVar51),auVar57);
                auVar56 = vpminsd_avx2(auVar54,auVar56);
                auVar54 = vpmaxsd_avx2(ZEXT1632(auVar52),auVar58);
                auVar56 = vpminsd_avx2(auVar56,auVar54);
                auVar34._4_4_ = uStack_265c;
                auVar34._0_4_ = local_2660;
                auVar34._8_4_ = uStack_2658;
                auVar34._12_4_ = uStack_2654;
                auVar34._16_4_ = uStack_2650;
                auVar34._20_4_ = uStack_264c;
                auVar34._24_4_ = uStack_2648;
                auVar34._28_4_ = uStack_2644;
                auVar54 = vpmaxsd_avx2(auVar73,auVar34);
                auVar56 = vpminsd_avx2(auVar56,local_2640);
                uVar14 = vpcmpd_avx512vl(auVar54,auVar56,2);
                uVar36 = uVar49;
                auVar59 = auVar55;
                if ((byte)uVar14 != 0) {
                  auVar54 = vblendmps_avx512vl(auVar124._0_32_,auVar73);
                  bVar38 = (bool)((byte)uVar14 & 1);
                  auVar59._0_4_ = (uint)bVar38 * auVar54._0_4_ | (uint)!bVar38 * auVar73._0_4_;
                  bVar38 = (bool)((byte)(uVar14 >> 1) & 1);
                  auVar59._4_4_ = (uint)bVar38 * auVar54._4_4_ | (uint)!bVar38 * auVar73._4_4_;
                  bVar38 = (bool)((byte)(uVar14 >> 2) & 1);
                  auVar59._8_4_ = (uint)bVar38 * auVar54._8_4_ | (uint)!bVar38 * auVar73._8_4_;
                  bVar38 = (bool)((byte)(uVar14 >> 3) & 1);
                  auVar59._12_4_ = (uint)bVar38 * auVar54._12_4_ | (uint)!bVar38 * auVar73._12_4_;
                  bVar38 = (bool)((byte)(uVar14 >> 4) & 1);
                  auVar59._16_4_ = (uint)bVar38 * auVar54._16_4_ | (uint)!bVar38 * auVar73._16_4_;
                  bVar38 = (bool)((byte)(uVar14 >> 5) & 1);
                  auVar59._20_4_ = (uint)bVar38 * auVar54._20_4_ | (uint)!bVar38 * auVar73._20_4_;
                  bVar38 = (bool)((byte)(uVar14 >> 6) & 1);
                  auVar59._24_4_ = (uint)bVar38 * auVar54._24_4_ | (uint)!bVar38 * auVar73._24_4_;
                  bVar38 = SUB81(uVar14 >> 7,0);
                  auVar59._28_4_ = (uint)bVar38 * auVar54._28_4_ | (uint)!bVar38 * auVar73._28_4_;
                  uVar36 = uVar13;
                  if (uVar49 != 8) {
                    *puVar47 = uVar49;
                    puVar47 = puVar47 + 1;
                    *pauVar45 = auVar55;
                    pauVar45 = pauVar45 + 1;
                  }
                }
                auVar55 = auVar59;
                uVar49 = uVar36;
              }
              if (uVar49 == 8) goto LAB_01d02fae;
              uVar11 = vcmpps_avx512vl(auVar55,local_2640,9);
              root.ptr = uVar49;
            } while ((byte)local_2c10 < (byte)POPCOUNT((int)uVar11));
            *puVar47 = uVar49;
            puVar47 = puVar47 + 1;
            *pauVar45 = auVar55;
            pauVar45 = pauVar45 + 1;
LAB_01d02fae:
            iVar39 = 4;
          }
          else {
            local_2a40 = auVar55;
            while (bVar42 = (byte)local_2c8c, uVar49 != 0) {
              k = 0;
              for (uVar13 = uVar49; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
                k = k + 1;
              }
              uVar49 = uVar49 - 1 & uVar49;
              in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
              in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
              in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
              bVar38 = occluded1(local_2b68,bvh,root,k,&local_2c51,ray,
                                 (TravRayK<8,_false> *)&local_2840.field_0,context);
              bVar37 = (byte)(1 << ((uint)k & 0x1f));
              if (!bVar38) {
                bVar37 = 0;
              }
              local_2c8c = (uint)(bVar42 | bVar37);
            }
            iVar39 = 3;
            auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar122 = ZEXT3264(auVar53);
            auVar53 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar123 = ZEXT3264(auVar53);
            auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar124 = ZEXT3264(auVar53);
            auVar53 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar125 = ZEXT3264(auVar53);
            auVar50 = vxorps_avx512vl(auVar126._0_16_,auVar126._0_16_);
            auVar126 = ZEXT1664(auVar50);
            if (bVar42 != 0xff) {
              auVar53 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              local_2640._0_4_ =
                   (uint)(bVar42 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar42 & 1) * local_2640._0_4_
              ;
              bVar38 = (bool)((byte)(local_2c8c >> 1) & 1);
              local_2640._4_4_ = (uint)bVar38 * auVar53._4_4_ | (uint)!bVar38 * local_2640._4_4_;
              bVar38 = (bool)((byte)(local_2c8c >> 2) & 1);
              local_2640._8_4_ = (uint)bVar38 * auVar53._8_4_ | (uint)!bVar38 * local_2640._8_4_;
              bVar38 = (bool)((byte)(local_2c8c >> 3) & 1);
              local_2640._12_4_ = (uint)bVar38 * auVar53._12_4_ | (uint)!bVar38 * local_2640._12_4_;
              bVar38 = (bool)((byte)(local_2c8c >> 4) & 1);
              local_2640._16_4_ = (uint)bVar38 * auVar53._16_4_ | (uint)!bVar38 * local_2640._16_4_;
              bVar38 = (bool)((byte)(local_2c8c >> 5) & 1);
              local_2640._20_4_ = (uint)bVar38 * auVar53._20_4_ | (uint)!bVar38 * local_2640._20_4_;
              bVar38 = (bool)((byte)(local_2c8c >> 6) & 1);
              local_2640._24_4_ = (uint)bVar38 * auVar53._24_4_ | (uint)!bVar38 * local_2640._24_4_;
              local_2640._28_4_ =
                   (local_2c8c >> 7) * auVar53._28_4_ |
                   (uint)!SUB41(local_2c8c >> 7,0) * local_2640._28_4_;
              iVar39 = 2;
            }
            auVar55 = local_2a40;
            if ((uint)local_2c10 < (uint)POPCOUNT(uVar46)) goto LAB_01d02e49;
          }
          auVar53 = auVar123._0_32_;
        } while (iVar39 != 3);
LAB_01d03d61:
        local_2c8c._0_1_ = (byte)local_2c8c & (byte)local_2c04;
        bVar38 = (bool)((byte)local_2c8c >> 1 & 1);
        bVar4 = (bool)((byte)local_2c8c >> 2 & 1);
        bVar5 = (bool)((byte)local_2c8c >> 3 & 1);
        bVar6 = (bool)((byte)local_2c8c >> 4 & 1);
        bVar7 = (bool)((byte)local_2c8c >> 5 & 1);
        bVar8 = (bool)((byte)local_2c8c >> 6 & 1);
        *(uint *)local_2c18 =
             (uint)((byte)local_2c8c & 1) * auVar53._0_4_ |
             (uint)!(bool)((byte)local_2c8c & 1) * *(int *)local_2c18;
        *(uint *)(local_2c18 + 4) =
             (uint)bVar38 * auVar53._4_4_ | (uint)!bVar38 * *(int *)(local_2c18 + 4);
        *(uint *)(local_2c18 + 8) =
             (uint)bVar4 * auVar53._8_4_ | (uint)!bVar4 * *(int *)(local_2c18 + 8);
        *(uint *)(local_2c18 + 0xc) =
             (uint)bVar5 * auVar53._12_4_ | (uint)!bVar5 * *(int *)(local_2c18 + 0xc);
        *(uint *)(local_2c18 + 0x10) =
             (uint)bVar6 * auVar53._16_4_ | (uint)!bVar6 * *(int *)(local_2c18 + 0x10);
        *(uint *)(local_2c18 + 0x14) =
             (uint)bVar7 * auVar53._20_4_ | (uint)!bVar7 * *(int *)(local_2c18 + 0x14);
        *(uint *)(local_2c18 + 0x18) =
             (uint)bVar8 * auVar53._24_4_ | (uint)!bVar8 * *(int *)(local_2c18 + 0x18);
        *(uint *)(local_2c18 + 0x1c) =
             (uint)((byte)local_2c8c >> 7) * auVar53._28_4_ |
             (uint)!(bool)((byte)local_2c8c >> 7) * *(int *)(local_2c18 + 0x1c);
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
LAB_01d03000:
  do {
    if (lVar40 == (ulong)((uint)root.ptr & 0xf) - 8) goto LAB_01d03c14;
    local_2a40._0_8_ = lVar40 * 0xe0 + (root.ptr & 0xfffffffffffffff0);
    lVar43 = 0;
    bVar37 = bVar42;
    do {
      auVar50 = auVar126._0_16_;
      if ((lVar43 == 4) ||
         (uVar49 = CONCAT44(0,*(uint *)(lVar41 + lVar43 * 4)), uVar49 == 0xffffffff))
      goto LAB_01d03bff;
      local_2c00 = (undefined1  [8])uVar49;
      uVar46 = *(undefined4 *)(lVar41 + -0xc0 + lVar43 * 4);
      auVar52._4_4_ = uVar46;
      auVar52._0_4_ = uVar46;
      auVar52._8_4_ = uVar46;
      auVar52._12_4_ = uVar46;
      auVar85._16_4_ = uVar46;
      auVar85._0_16_ = auVar52;
      auVar85._20_4_ = uVar46;
      auVar85._24_4_ = uVar46;
      auVar85._28_4_ = uVar46;
      uVar46 = *(undefined4 *)(lVar41 + -0xb0 + lVar43 * 4);
      auVar104._4_4_ = uVar46;
      auVar104._0_4_ = uVar46;
      auVar104._8_4_ = uVar46;
      auVar104._12_4_ = uVar46;
      auVar105._16_4_ = uVar46;
      auVar105._0_16_ = auVar104;
      auVar105._20_4_ = uVar46;
      auVar105._24_4_ = uVar46;
      auVar105._28_4_ = uVar46;
      uVar46 = *(undefined4 *)(lVar41 + -0xa0 + lVar43 * 4);
      auVar108._4_4_ = uVar46;
      auVar108._0_4_ = uVar46;
      auVar108._8_4_ = uVar46;
      auVar108._12_4_ = uVar46;
      auVar110._16_4_ = uVar46;
      auVar110._0_16_ = auVar108;
      auVar110._20_4_ = uVar46;
      auVar110._24_4_ = uVar46;
      auVar110._28_4_ = uVar46;
      auVar60 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar41 + -0x90 + lVar43 * 4)));
      auVar61 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar41 + -0x80 + lVar43 * 4)));
      auVar62 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar41 + -0x70 + lVar43 * 4)));
      auVar63 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar41 + -0x60 + lVar43 * 4)));
      auVar64 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar41 + -0x50 + lVar43 * 4)));
      auVar65 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar41 + -0x40 + lVar43 * 4)));
      auVar66 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar41 + -0x30 + lVar43 * 4)));
      auVar67 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar41 + -0x20 + lVar43 * 4)));
      auVar68 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar41 + -0x10 + lVar43 * 4)));
      local_2b30 = *(undefined8 *)(local_2a40._0_8_ + 0xd0);
      uStack_2b28 = *(undefined8 *)(local_2a40._0_8_ + 0xd8);
      auVar51 = vsubss_avx512f(auVar52,auVar60._0_16_);
      fVar80 = auVar51._0_4_;
      auVar87._4_4_ = fVar80;
      auVar87._0_4_ = fVar80;
      auVar87._8_4_ = fVar80;
      auVar87._12_4_ = fVar80;
      auVar87._16_4_ = fVar80;
      auVar87._20_4_ = fVar80;
      auVar87._24_4_ = fVar80;
      auVar87._28_4_ = fVar80;
      auVar51 = vsubss_avx512f(auVar104,auVar61._0_16_);
      fVar75 = auVar51._0_4_;
      auVar102._4_4_ = fVar75;
      auVar102._0_4_ = fVar75;
      auVar102._8_4_ = fVar75;
      auVar102._12_4_ = fVar75;
      auVar102._16_4_ = fVar75;
      auVar102._20_4_ = fVar75;
      auVar102._24_4_ = fVar75;
      auVar102._28_4_ = fVar75;
      auVar51 = vsubss_avx512f(auVar108,auVar62._0_16_);
      fVar76 = auVar51._0_4_;
      auVar112._4_4_ = fVar76;
      auVar112._0_4_ = fVar76;
      auVar112._8_4_ = fVar76;
      auVar112._12_4_ = fVar76;
      auVar112._16_4_ = fVar76;
      auVar112._20_4_ = fVar76;
      auVar112._24_4_ = fVar76;
      auVar112._28_4_ = fVar76;
      auVar51 = vsubss_avx512f(auVar66._0_16_,auVar52);
      fVar90 = auVar51._0_4_;
      auVar121._4_4_ = fVar90;
      auVar121._0_4_ = fVar90;
      auVar121._8_4_ = fVar90;
      auVar121._12_4_ = fVar90;
      auVar121._16_4_ = fVar90;
      auVar121._20_4_ = fVar90;
      auVar121._24_4_ = fVar90;
      auVar121._28_4_ = fVar90;
      auVar51 = vsubss_avx512f(auVar67._0_16_,auVar104);
      auVar69 = vbroadcastss_avx512vl(auVar51);
      auVar52 = vsubss_avx512f(auVar68._0_16_,auVar108);
      auVar70 = vbroadcastss_avx512vl(auVar52);
      fVar75 = auVar52._0_4_ * fVar75;
      auVar57._4_4_ = fVar75;
      auVar57._0_4_ = fVar75;
      auVar57._8_4_ = fVar75;
      auVar57._12_4_ = fVar75;
      auVar57._16_4_ = fVar75;
      auVar57._20_4_ = fVar75;
      auVar57._24_4_ = fVar75;
      auVar57._28_4_ = fVar75;
      local_29c0.field_0.x.field_0 = (vfloat_impl<8>)vfmsub231ps_avx512vl(auVar57,auVar69,auVar112);
      fVar90 = fVar76 * fVar90;
      auVar71._4_4_ = fVar90;
      auVar71._0_4_ = fVar90;
      auVar71._8_4_ = fVar90;
      auVar71._12_4_ = fVar90;
      auVar71._16_4_ = fVar90;
      auVar71._20_4_ = fVar90;
      auVar71._24_4_ = fVar90;
      auVar71._28_4_ = fVar90;
      auVar71 = vfmsub231ps_avx512vl(auVar71,auVar70,auVar87);
      uStack_2944 = auVar71._28_4_;
      auVar79 = ZEXT436(uStack_2944);
      auVar78 = ZEXT436(uStack_2944);
      fVar80 = auVar51._0_4_ * fVar80;
      auVar81._4_4_ = fVar80;
      auVar81._0_4_ = fVar80;
      auVar81._8_4_ = fVar80;
      auVar81._12_4_ = fVar80;
      auVar81._16_4_ = fVar80;
      auVar81._20_4_ = fVar80;
      auVar81._24_4_ = fVar80;
      auVar81._28_4_ = fVar80;
      auVar104 = vfmsub231ps_fma(auVar81,auVar121,auVar102);
      auVar84 = (undefined1  [36])0x0;
      auVar83 = (undefined1  [36])0x0;
      auVar54 = vsubps_avx(auVar85,*(undefined1 (*) [32])ray);
      auVar56 = vsubps_avx(auVar105,*(undefined1 (*) [32])(ray + 0x20));
      auVar57 = vsubps_avx(auVar110,*(undefined1 (*) [32])(ray + 0x40));
      auVar53 = *(undefined1 (*) [32])(ray + 0x80);
      auVar55 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar73 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar116._0_4_ = auVar55._0_4_ * auVar57._0_4_;
      auVar116._4_4_ = auVar55._4_4_ * auVar57._4_4_;
      auVar116._8_4_ = auVar55._8_4_ * auVar57._8_4_;
      auVar116._12_4_ = auVar55._12_4_ * auVar57._12_4_;
      auVar116._16_4_ = auVar55._16_4_ * auVar57._16_4_;
      auVar116._20_4_ = auVar55._20_4_ * auVar57._20_4_;
      auVar116._28_36_ = in_ZMM12._28_36_;
      auVar116._24_4_ = auVar55._24_4_ * auVar57._24_4_;
      auVar108 = vfmsub231ps_fma(auVar116._0_32_,auVar56,auVar73);
      in_ZMM12 = ZEXT1664(auVar108);
      auVar117._0_4_ = auVar73._0_4_ * auVar54._0_4_;
      auVar117._4_4_ = auVar73._4_4_ * auVar54._4_4_;
      auVar117._8_4_ = auVar73._8_4_ * auVar54._8_4_;
      auVar117._12_4_ = auVar73._12_4_ * auVar54._12_4_;
      auVar117._16_4_ = auVar73._16_4_ * auVar54._16_4_;
      auVar117._20_4_ = auVar73._20_4_ * auVar54._20_4_;
      auVar117._28_36_ = in_ZMM13._28_36_;
      auVar117._24_4_ = auVar73._24_4_ * auVar54._24_4_;
      auVar15 = vfmsub231ps_fma(auVar117._0_32_,auVar57,auVar53);
      in_ZMM13 = ZEXT1664(auVar15);
      auVar119._0_4_ = auVar53._0_4_ * auVar56._0_4_;
      auVar119._4_4_ = auVar53._4_4_ * auVar56._4_4_;
      auVar119._8_4_ = auVar53._8_4_ * auVar56._8_4_;
      auVar119._12_4_ = auVar53._12_4_ * auVar56._12_4_;
      auVar119._16_4_ = auVar53._16_4_ * auVar56._16_4_;
      auVar119._20_4_ = auVar53._20_4_ * auVar56._20_4_;
      auVar119._28_36_ = in_ZMM14._28_36_;
      auVar119._24_4_ = auVar53._24_4_ * auVar56._24_4_;
      auVar16 = vfmsub231ps_fma(auVar119._0_32_,auVar54,auVar55);
      in_ZMM14 = ZEXT1664(auVar16);
      auVar58._4_4_ = auVar73._4_4_ * auVar104._4_4_;
      auVar58._0_4_ = auVar73._0_4_ * auVar104._0_4_;
      auVar58._8_4_ = auVar73._8_4_ * auVar104._8_4_;
      auVar58._12_4_ = auVar73._12_4_ * auVar104._12_4_;
      auVar58._16_4_ = auVar73._16_4_ * 0.0;
      auVar58._20_4_ = auVar73._20_4_ * 0.0;
      auVar58._24_4_ = auVar73._24_4_ * 0.0;
      auVar58._28_4_ = auVar73._28_4_;
      auVar51 = vfmadd231ps_fma(auVar58,auVar71,auVar55);
      auVar51 = vfmadd231ps_fma(ZEXT1632(auVar51),(undefined1  [32])local_29c0.field_0.x.field_0,
                                auVar53);
      vandps_avx512vl(ZEXT1632(auVar51),auVar125._0_32_);
      auVar53 = vmulps_avx512vl(auVar70,ZEXT1632(auVar16));
      auVar53 = vfmadd231ps_avx512vl(auVar53,ZEXT1632(auVar15),auVar69);
      auVar52 = vfmadd231ps_fma(auVar53,ZEXT1632(auVar108),auVar121);
      uVar48 = auVar71._0_4_;
      auVar69._0_4_ = (float)(uVar48 ^ auVar52._0_4_);
      uVar113 = auVar71._4_4_;
      auVar69._4_4_ = (float)(uVar113 ^ auVar52._4_4_);
      uVar114 = auVar71._8_4_;
      auVar69._8_4_ = (float)(uVar114 ^ auVar52._8_4_);
      uVar115 = auVar71._12_4_;
      auVar69._12_4_ = (float)(uVar115 ^ auVar52._12_4_);
      fVar75 = auVar71._16_4_;
      auVar69._16_4_ = fVar75;
      fVar90 = auVar71._20_4_;
      auVar69._20_4_ = fVar90;
      fVar80 = auVar71._24_4_;
      auVar69._24_4_ = fVar80;
      auVar69._28_4_ = uStack_2944;
      uVar11 = vcmpps_avx512vl(auVar69,auVar126._0_32_,5);
      bVar44 = (byte)uVar11 & bVar37;
      if (bVar44 != 0) {
        auVar70._4_4_ = fVar76 * auVar16._4_4_;
        auVar70._0_4_ = fVar76 * auVar16._0_4_;
        auVar70._8_4_ = fVar76 * auVar16._8_4_;
        auVar70._12_4_ = fVar76 * auVar16._12_4_;
        auVar70._16_4_ = fVar76 * 0.0;
        auVar70._20_4_ = fVar76 * 0.0;
        auVar70._24_4_ = fVar76 * 0.0;
        auVar70._28_4_ = fVar76;
        auVar52 = vfmadd213ps_fma(auVar102,ZEXT1632(auVar15),auVar70);
        auVar52 = vfmadd213ps_fma(auVar87,ZEXT1632(auVar108),ZEXT1632(auVar52));
        auVar88._0_4_ = (float)(uVar48 ^ auVar52._0_4_);
        auVar88._4_4_ = (float)(uVar113 ^ auVar52._4_4_);
        auVar88._8_4_ = (float)(uVar114 ^ auVar52._8_4_);
        auVar88._12_4_ = (float)(uVar115 ^ auVar52._12_4_);
        auVar88._16_4_ = fVar75;
        auVar88._20_4_ = fVar90;
        auVar88._24_4_ = fVar80;
        auVar88._28_4_ = uStack_2944;
        uVar11 = vcmpps_avx512vl(auVar88,auVar126._0_32_,5);
        bVar44 = bVar44 & (byte)uVar11;
        if (bVar44 != 0) {
          vandps_avx512vl(ZEXT1632(auVar51),auVar122._0_32_);
          auVar55 = vsubps_avx(auVar53,auVar69);
          uVar11 = vcmpps_avx512vl(auVar55,auVar88,5);
          bVar44 = bVar44 & (byte)uVar11;
          if (bVar44 != 0) {
            local_2b20 = auVar68;
            local_2b00 = auVar67;
            local_2ae0 = auVar66;
            local_2ac0 = auVar62;
            local_2aa0 = auVar61;
            local_2a80 = auVar60;
            local_2a60 = auVar65;
            auVar66._4_4_ = auVar57._4_4_ * auVar104._4_4_;
            auVar66._0_4_ = auVar57._0_4_ * auVar104._0_4_;
            auVar66._8_4_ = auVar57._8_4_ * auVar104._8_4_;
            auVar66._12_4_ = auVar57._12_4_ * auVar104._12_4_;
            auVar66._16_4_ = auVar57._16_4_ * 0.0;
            auVar66._20_4_ = auVar57._20_4_ * 0.0;
            auVar66._24_4_ = auVar57._24_4_ * 0.0;
            auVar66._28_4_ = auVar57._28_4_;
            auVar52 = vfmadd213ps_fma(auVar56,auVar71,auVar66);
            auVar52 = vfmadd213ps_fma(auVar54,(undefined1  [32])local_29c0.field_0.x.field_0,
                                      ZEXT1632(auVar52));
            auVar68._0_4_ = auVar53._0_4_ * *(float *)(ray + 0x60);
            auVar68._4_4_ = auVar53._4_4_ * *(float *)(ray + 100);
            auVar68._8_4_ = auVar53._8_4_ * *(float *)(ray + 0x68);
            auVar68._12_4_ = auVar53._12_4_ * *(float *)(ray + 0x6c);
            auVar68._16_4_ = auVar53._16_4_ * *(float *)(ray + 0x70);
            auVar68._20_4_ = auVar53._20_4_ * *(float *)(ray + 0x74);
            auVar68._24_4_ = auVar53._24_4_ * *(float *)(ray + 0x78);
            auVar68._28_4_ = 0;
            auVar65._0_4_ = (float)(uVar48 ^ auVar52._0_4_);
            auVar65._4_4_ = (float)(uVar113 ^ auVar52._4_4_);
            auVar65._8_4_ = (float)(uVar114 ^ auVar52._8_4_);
            auVar65._12_4_ = (float)(uVar115 ^ auVar52._12_4_);
            auVar65._16_4_ = fVar75;
            auVar65._20_4_ = fVar90;
            auVar65._24_4_ = fVar80;
            auVar65._28_4_ = uStack_2944;
            auVar67._4_4_ = auVar53._4_4_ * *(float *)(ray + 0x104);
            auVar67._0_4_ = auVar53._0_4_ * *(float *)(ray + 0x100);
            auVar67._8_4_ = auVar53._8_4_ * *(float *)(ray + 0x108);
            auVar67._12_4_ = auVar53._12_4_ * *(float *)(ray + 0x10c);
            auVar67._16_4_ = auVar53._16_4_ * *(float *)(ray + 0x110);
            auVar67._20_4_ = auVar53._20_4_ * *(float *)(ray + 0x114);
            auVar67._24_4_ = auVar53._24_4_ * *(float *)(ray + 0x118);
            auVar67._28_4_ = auVar57._28_4_;
            uVar11 = vcmpps_avx512vl(auVar65,auVar67,2);
            uVar12 = vcmpps_avx512vl(auVar68,auVar65,1);
            bVar44 = bVar44 & (byte)uVar11 & (byte)uVar12;
            local_2bc0 = auVar63;
            local_2b60 = auVar64;
            auVar78 = auVar79;
            auVar83 = auVar84;
            if (bVar44 != 0) {
              uVar11 = vcmpps_avx512vl(ZEXT1632(auVar51),ZEXT832(0) << 0x20,4);
              bVar44 = bVar44 & (byte)uVar11;
              if (bVar44 != 0) {
                local_2c20 = (context->scene->geometries).items[uVar49].ptr;
                uVar48 = local_2c20->mask;
                auVar63._4_4_ = uVar48;
                auVar63._0_4_ = uVar48;
                auVar63._8_4_ = uVar48;
                auVar63._12_4_ = uVar48;
                auVar63._16_4_ = uVar48;
                auVar63._20_4_ = uVar48;
                auVar63._24_4_ = uVar48;
                auVar63._28_4_ = uVar48;
                uVar11 = vptestmd_avx512vl(auVar63,*(undefined1 (*) [32])(ray + 0x120));
                bVar44 = bVar44 & (byte)uVar11;
                if (bVar44 != 0) {
                  local_2c08 = *(undefined4 *)((long)&local_2b30 + lVar43 * 4);
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (auVar78 = ZEXT436(uStack_2944), auVar83 = (undefined1  [36])0x0,
                     local_2c20->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar55 = vrcp14ps_avx512vl(auVar53);
                    auVar61._8_4_ = 0x3f800000;
                    auVar61._0_8_ = 0x3f8000003f800000;
                    auVar61._12_4_ = 0x3f800000;
                    auVar61._16_4_ = 0x3f800000;
                    auVar61._20_4_ = 0x3f800000;
                    auVar61._24_4_ = 0x3f800000;
                    auVar61._28_4_ = 0x3f800000;
                    auVar51 = vfnmadd213ps_fma(auVar53,auVar55,auVar61);
                    auVar51 = vfmadd132ps_fma(ZEXT1632(auVar51),auVar55,auVar55);
                    fVar76 = auVar51._0_4_;
                    fVar92 = auVar51._4_4_;
                    fVar94 = auVar51._8_4_;
                    fVar96 = auVar51._12_4_;
                    auVar64._4_4_ = fVar92 * auVar69._4_4_;
                    auVar64._0_4_ = fVar76 * auVar69._0_4_;
                    auVar64._8_4_ = fVar94 * auVar69._8_4_;
                    auVar64._12_4_ = fVar96 * auVar69._12_4_;
                    auVar64._16_4_ = fVar75 * 0.0;
                    auVar64._20_4_ = fVar90 * 0.0;
                    auVar64._24_4_ = fVar80 * 0.0;
                    auVar64._28_4_ = uStack_2944;
                    local_2920 = vminps_avx(auVar64,auVar61);
                    auVar60._4_4_ = fVar92 * auVar88._4_4_;
                    auVar60._0_4_ = fVar76 * auVar88._0_4_;
                    auVar60._8_4_ = fVar94 * auVar88._8_4_;
                    auVar60._12_4_ = fVar96 * auVar88._12_4_;
                    auVar60._16_4_ = fVar75 * 0.0;
                    auVar60._20_4_ = fVar90 * 0.0;
                    auVar60._24_4_ = fVar80 * 0.0;
                    auVar60._28_4_ = uStack_2944;
                    local_2940 = vminps_avx(auVar60,auVar61);
                    local_29c0.field_0.z.field_0 = (vfloat_impl<8>)ZEXT1632(auVar104);
                    local_2960._4_4_ = fVar92 * auVar65._4_4_;
                    local_2960._0_4_ = fVar76 * auVar65._0_4_;
                    fStack_2958 = fVar94 * auVar65._8_4_;
                    fStack_2954 = fVar96 * auVar65._12_4_;
                    fStack_2950 = fVar75 * 0.0;
                    fStack_294c = fVar90 * 0.0;
                    fStack_2948 = fVar80 * 0.0;
                    local_2c50.valid = local_28a0;
                    local_2c50.geometryUserPtr = &local_2a20;
                    local_2c50.context = local_2a00;
                    local_2c50.ray = local_29e0;
                    in_ZMM12 = ZEXT1664(auVar108);
                    in_ZMM13 = ZEXT1664(auVar15);
                    in_ZMM14 = ZEXT1664(auVar16);
                    local_29c0._32_32_ = auVar71;
                    std::
                    _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
                    ::
                    _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                              ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                                *)&local_2c50,
                               (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                                *)&local_29c0.field_0);
                    pRVar2 = context->user;
                    local_2900 = vpbroadcastd_avx512vl();
                    local_2920 = vpbroadcastd_avx512vl();
                    auVar78 = ZEXT436(local_2920._28_4_);
                    local_29c0.field_0.y.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_2880;
                    local_29c0.field_0.z.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_2860;
                    auVar83 = ZEXT436((uint)local_2a00[3].instPrimID[0]);
                    auVar53 = vpcmpeqd_avx2(local_2900,local_2900);
                    local_2bc8[1] = auVar53;
                    *local_2bc8 = auVar53;
                    local_28e0 = pRVar2->instID[0];
                    uStack_28dc = local_28e0;
                    uStack_28d8 = local_28e0;
                    uStack_28d4 = local_28e0;
                    uStack_28d0 = local_28e0;
                    uStack_28cc = local_28e0;
                    uStack_28c8 = local_28e0;
                    uStack_28c4 = local_28e0;
                    local_28c0 = pRVar2->instPrimID[0];
                    uStack_28bc = local_28c0;
                    uStack_28b8 = local_28c0;
                    uStack_28b4 = local_28c0;
                    uStack_28b0 = local_28c0;
                    uStack_28ac = local_28c0;
                    uStack_28a8 = local_28c0;
                    uStack_28a4 = local_28c0;
                    _local_2c00 = *(undefined1 (*) [32])(ray + 0x100);
                    auVar53 = vblendmps_avx512vl(_local_2c00,(undefined1  [32])local_2a20);
                    bVar38 = (bool)(bVar44 >> 1 & 1);
                    bVar4 = (bool)(bVar44 >> 2 & 1);
                    bVar5 = (bool)(bVar44 >> 3 & 1);
                    bVar6 = (bool)(bVar44 >> 4 & 1);
                    bVar7 = (bool)(bVar44 >> 5 & 1);
                    bVar8 = (bool)(bVar44 >> 6 & 1);
                    *(uint *)(ray + 0x100) =
                         (uint)(bVar44 & 1) * auVar53._0_4_ |
                         (uint)!(bool)(bVar44 & 1) * local_2c00._0_4_;
                    *(uint *)(ray + 0x104) =
                         (uint)bVar38 * auVar53._4_4_ | (uint)!bVar38 * local_2c00._4_4_;
                    *(uint *)(ray + 0x108) =
                         (uint)bVar4 * auVar53._8_4_ | (uint)!bVar4 * local_2c00._8_4_;
                    *(uint *)(ray + 0x10c) =
                         (uint)bVar5 * auVar53._12_4_ | (uint)!bVar5 * local_2c00._12_4_;
                    *(uint *)(ray + 0x110) =
                         (uint)bVar6 * auVar53._16_4_ | (uint)!bVar6 * local_2c00._16_4_;
                    *(uint *)(ray + 0x114) =
                         (uint)bVar7 * auVar53._20_4_ | (uint)!bVar7 * local_2c00._20_4_;
                    *(uint *)(ray + 0x118) =
                         (uint)bVar8 * auVar53._24_4_ | (uint)!bVar8 * local_2c00._24_4_;
                    *(uint *)(ray + 0x11c) =
                         (uint)(bVar44 >> 7) * auVar53._28_4_ |
                         (uint)!(bool)(bVar44 >> 7) * local_2c00._28_4_;
                    local_2ba0 = vpmovm2d_avx512vl((ulong)bVar44);
                    local_2c50.valid = (int *)local_2ba0;
                    local_2c50.geometryUserPtr = local_2c20->userPtr;
                    local_2c50.context = context->user;
                    local_2c50.hit = (RTCHitN *)&local_29c0;
                    local_2c50.N = 8;
                    local_2c50.ray = (RTCRayN *)ray;
                    if (local_2c20->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar83 = (undefined1  [36])0x0;
                      in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                      in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                      in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                      (*local_2c20->occlusionFilterN)(&local_2c50);
                      auVar78 = extraout_var;
                    }
                    if (local_2ba0 == (undefined1  [32])0x0) {
                      uVar48 = 0;
                    }
                    else {
                      p_Var3 = context->args->filter;
                      if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((local_2c20->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar83 = (undefined1  [36])0x0;
                        in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                        in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                        in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                        (*p_Var3)(&local_2c50);
                        auVar78 = extraout_var_00;
                      }
                      uVar49 = vptestmd_avx512vl(local_2ba0,local_2ba0);
                      iVar39 = *(int *)((RayK<8> *)(local_2c50.ray + 0x100) + 4);
                      iVar26 = *(int *)((RayK<8> *)(local_2c50.ray + 0x100) + 8);
                      iVar27 = *(int *)((RayK<8> *)(local_2c50.ray + 0x100) + 0xc);
                      iVar28 = *(int *)((RayK<8> *)(local_2c50.ray + 0x100) + 0x10);
                      iVar29 = *(int *)((RayK<8> *)(local_2c50.ray + 0x100) + 0x14);
                      iVar30 = *(int *)((RayK<8> *)(local_2c50.ray + 0x100) + 0x18);
                      iVar31 = *(int *)((RayK<8> *)(local_2c50.ray + 0x100) + 0x1c);
                      auVar53 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar38 = (bool)((byte)uVar49 & 1);
                      bVar4 = (bool)((byte)(uVar49 >> 1) & 1);
                      bVar5 = (bool)((byte)(uVar49 >> 2) & 1);
                      bVar6 = (bool)((byte)(uVar49 >> 3) & 1);
                      bVar7 = (bool)((byte)(uVar49 >> 4) & 1);
                      bVar8 = (bool)((byte)(uVar49 >> 5) & 1);
                      bVar9 = (bool)((byte)(uVar49 >> 6) & 1);
                      bVar10 = SUB81(uVar49 >> 7,0);
                      uVar48 = (uint)uVar49;
                      *(uint *)(local_2c50.ray + 0x100) =
                           (uint)bVar38 * auVar53._0_4_ |
                           (uint)!bVar38 * *(int *)(local_2c50.ray + 0x100);
                      *(uint *)((RayK<8> *)(local_2c50.ray + 0x100) + 4) =
                           (uint)bVar4 * auVar53._4_4_ | (uint)!bVar4 * iVar39;
                      *(uint *)((RayK<8> *)(local_2c50.ray + 0x100) + 8) =
                           (uint)bVar5 * auVar53._8_4_ | (uint)!bVar5 * iVar26;
                      *(uint *)((RayK<8> *)(local_2c50.ray + 0x100) + 0xc) =
                           (uint)bVar6 * auVar53._12_4_ | (uint)!bVar6 * iVar27;
                      *(uint *)((RayK<8> *)(local_2c50.ray + 0x100) + 0x10) =
                           (uint)bVar7 * auVar53._16_4_ | (uint)!bVar7 * iVar28;
                      *(uint *)((RayK<8> *)(local_2c50.ray + 0x100) + 0x14) =
                           (uint)bVar8 * auVar53._20_4_ | (uint)!bVar8 * iVar29;
                      *(uint *)((RayK<8> *)(local_2c50.ray + 0x100) + 0x18) =
                           (uint)bVar9 * auVar53._24_4_ | (uint)!bVar9 * iVar30;
                      *(uint *)((RayK<8> *)(local_2c50.ray + 0x100) + 0x1c) =
                           (uint)bVar10 * auVar53._28_4_ | (uint)!bVar10 * iVar31;
                    }
                    bVar44 = (byte)uVar48;
                    auVar62._0_4_ =
                         (uint)(bVar44 & 1) * *(int *)local_2c18 |
                         (uint)!(bool)(bVar44 & 1) * local_2c00._0_4_;
                    bVar38 = (bool)((byte)(uVar48 >> 1) & 1);
                    auVar62._4_4_ =
                         (uint)bVar38 * *(int *)(local_2c18 + 4) | (uint)!bVar38 * local_2c00._4_4_;
                    bVar38 = (bool)((byte)(uVar48 >> 2) & 1);
                    auVar62._8_4_ =
                         (uint)bVar38 * *(int *)(local_2c18 + 8) | (uint)!bVar38 * iStack_2bf8;
                    bVar38 = (bool)((byte)(uVar48 >> 3) & 1);
                    auVar62._12_4_ =
                         (uint)bVar38 * *(int *)(local_2c18 + 0xc) | (uint)!bVar38 * iStack_2bf4;
                    bVar38 = (bool)((byte)(uVar48 >> 4) & 1);
                    auVar62._16_4_ =
                         (uint)bVar38 * *(int *)(local_2c18 + 0x10) | (uint)!bVar38 * iStack_2bf0;
                    bVar38 = (bool)((byte)(uVar48 >> 5) & 1);
                    auVar62._20_4_ =
                         (uint)bVar38 * *(int *)(local_2c18 + 0x14) | (uint)!bVar38 * iStack_2bec;
                    bVar38 = (bool)((byte)(uVar48 >> 6) & 1);
                    auVar62._24_4_ =
                         (uint)bVar38 * *(int *)(local_2c18 + 0x18) | (uint)!bVar38 * iStack_2be8;
                    bVar38 = (bool)((byte)(uVar48 >> 7) & 1);
                    auVar62._28_4_ =
                         (uint)bVar38 * *(int *)(local_2c18 + 0x1c) | (uint)!bVar38 * iStack_2be4;
                    *(undefined1 (*) [32])local_2c18 = auVar62;
                  }
                  bVar37 = bVar37 & ~bVar44;
                }
              }
            }
            auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar122 = ZEXT3264(auVar53);
            auVar53 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar123 = ZEXT3264(auVar53);
            auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar124 = ZEXT3264(auVar53);
            auVar53 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar125 = ZEXT3264(auVar53);
            auVar50 = vxorps_avx512vl(auVar50,auVar50);
            auVar126 = ZEXT1664(auVar50);
            auVar63 = local_2bc0;
            auVar66 = local_2ae0;
            auVar64 = local_2b60;
            auVar67 = local_2b00;
            auVar65 = local_2a60;
            auVar68 = local_2b20;
            auVar60 = local_2a80;
            auVar61 = local_2aa0;
            auVar62 = local_2ac0;
          }
        }
      }
      auVar53 = _local_2c00;
      auVar50 = auVar126._0_16_;
      if (bVar37 == 0) break;
      auVar56 = vsubps_avx512vl(auVar63,auVar66);
      auVar57 = vsubps_avx512vl(auVar64,auVar67);
      auVar58 = vsubps_avx512vl(auVar65,auVar68);
      auVar66 = vsubps_avx512vl(auVar60,auVar63);
      auVar67 = vsubps_avx512vl(auVar61,auVar64);
      auVar68 = vsubps_avx512vl(auVar62,auVar65);
      auVar55 = vmulps_avx512vl(auVar57,auVar68);
      auVar52 = vfmsub231ps_fma(auVar55,auVar67,auVar58);
      auVar77._0_4_ = auVar58._0_4_ * auVar66._0_4_;
      auVar77._4_4_ = auVar58._4_4_ * auVar66._4_4_;
      auVar77._8_4_ = auVar58._8_4_ * auVar66._8_4_;
      auVar77._12_4_ = auVar58._12_4_ * auVar66._12_4_;
      auVar77._16_4_ = auVar58._16_4_ * auVar66._16_4_;
      auVar77._20_4_ = auVar58._20_4_ * auVar66._20_4_;
      auVar77._24_4_ = auVar58._24_4_ * auVar66._24_4_;
      auVar77._28_36_ = auVar78;
      vVar72.field_0 =
           (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
           vfmsub231ps_avx512vl(auVar77._0_32_,auVar68,auVar56);
      auVar82._0_4_ = auVar67._0_4_ * auVar56._0_4_;
      auVar82._4_4_ = auVar67._4_4_ * auVar56._4_4_;
      auVar82._8_4_ = auVar67._8_4_ * auVar56._8_4_;
      auVar82._12_4_ = auVar67._12_4_ * auVar56._12_4_;
      auVar82._16_4_ = auVar67._16_4_ * auVar56._16_4_;
      auVar82._20_4_ = auVar67._20_4_ * auVar56._20_4_;
      auVar82._24_4_ = auVar67._24_4_ * auVar56._24_4_;
      auVar82._28_36_ = auVar83;
      auVar104 = vfmsub231ps_fma(auVar82._0_32_,auVar66,auVar57);
      auVar63 = vsubps_avx512vl(auVar63,*(undefined1 (*) [32])ray);
      auVar64 = vsubps_avx512vl(auVar64,*(undefined1 (*) [32])(ray + 0x20));
      auVar65 = vsubps_avx512vl(auVar65,*(undefined1 (*) [32])(ray + 0x40));
      auVar55 = *(undefined1 (*) [32])(ray + 0x80);
      auVar73 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar54 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar60 = vmulps_avx512vl(auVar73,auVar65);
      auVar108 = vfmsub231ps_fma(auVar60,auVar64,auVar54);
      in_ZMM12 = ZEXT1664(auVar108);
      auVar118._0_4_ = auVar54._0_4_ * auVar63._0_4_;
      auVar118._4_4_ = auVar54._4_4_ * auVar63._4_4_;
      auVar118._8_4_ = auVar54._8_4_ * auVar63._8_4_;
      auVar118._12_4_ = auVar54._12_4_ * auVar63._12_4_;
      auVar118._16_4_ = auVar54._16_4_ * auVar63._16_4_;
      auVar118._20_4_ = auVar54._20_4_ * auVar63._20_4_;
      auVar118._28_36_ = in_ZMM13._28_36_;
      auVar118._24_4_ = auVar54._24_4_ * auVar63._24_4_;
      auVar15 = vfmsub231ps_fma(auVar118._0_32_,auVar65,auVar55);
      in_ZMM13 = ZEXT1664(auVar15);
      auVar120._0_4_ = auVar55._0_4_ * auVar64._0_4_;
      auVar120._4_4_ = auVar55._4_4_ * auVar64._4_4_;
      auVar120._8_4_ = auVar55._8_4_ * auVar64._8_4_;
      auVar120._12_4_ = auVar55._12_4_ * auVar64._12_4_;
      auVar120._16_4_ = auVar55._16_4_ * auVar64._16_4_;
      auVar120._20_4_ = auVar55._20_4_ * auVar64._20_4_;
      auVar120._28_36_ = in_ZMM14._28_36_;
      auVar120._24_4_ = auVar55._24_4_ * auVar64._24_4_;
      auVar60 = vfmsub231ps_avx512vl(auVar120._0_32_,auVar63,auVar73);
      in_ZMM14 = ZEXT3264(auVar60);
      auVar20._4_4_ = auVar54._4_4_ * auVar104._4_4_;
      auVar20._0_4_ = auVar54._0_4_ * auVar104._0_4_;
      auVar20._8_4_ = auVar54._8_4_ * auVar104._8_4_;
      auVar20._12_4_ = auVar54._12_4_ * auVar104._12_4_;
      auVar20._16_4_ = auVar54._16_4_ * 0.0;
      auVar20._20_4_ = auVar54._20_4_ * 0.0;
      auVar20._24_4_ = auVar54._24_4_ * 0.0;
      auVar20._28_4_ = auVar54._28_4_;
      auVar73 = vfmadd231ps_avx512vl(auVar20,(undefined1  [32])vVar72.field_0,auVar73);
      auVar51 = vfmadd231ps_fma(auVar73,ZEXT1632(auVar52),auVar55);
      vandps_avx512vl(ZEXT1632(auVar51),auVar125._0_32_);
      auVar55 = vmulps_avx512vl(auVar68,auVar60);
      auVar55 = vfmadd231ps_avx512vl(auVar55,ZEXT1632(auVar15),auVar67);
      auVar55 = vfmadd231ps_avx512vl(auVar55,ZEXT1632(auVar108),auVar66);
      auVar55 = vxorps_avx512vl(auVar73,auVar55);
      uVar11 = vcmpps_avx512vl(auVar55,auVar126._0_32_,5);
      bVar44 = (byte)uVar11 & bVar37;
      if (bVar44 != 0) {
        auVar21._4_4_ = auVar58._4_4_ * auVar60._4_4_;
        auVar21._0_4_ = auVar58._0_4_ * auVar60._0_4_;
        auVar21._8_4_ = auVar58._8_4_ * auVar60._8_4_;
        auVar21._12_4_ = auVar58._12_4_ * auVar60._12_4_;
        auVar21._16_4_ = auVar58._16_4_ * auVar60._16_4_;
        auVar21._20_4_ = auVar58._20_4_ * auVar60._20_4_;
        auVar21._24_4_ = auVar58._24_4_ * auVar60._24_4_;
        auVar21._28_4_ = auVar58._28_4_;
        auVar16 = vfmadd213ps_fma(auVar57,ZEXT1632(auVar15),auVar21);
        auVar16 = vfmadd213ps_fma(auVar56,ZEXT1632(auVar108),ZEXT1632(auVar16));
        auVar89._0_4_ = (float)(auVar73._0_4_ ^ auVar16._0_4_);
        auVar89._4_4_ = (float)(auVar73._4_4_ ^ auVar16._4_4_);
        auVar89._8_4_ = (float)(auVar73._8_4_ ^ auVar16._8_4_);
        auVar89._12_4_ = (float)(auVar73._12_4_ ^ auVar16._12_4_);
        fVar75 = auVar73._16_4_;
        auVar89._16_4_ = fVar75;
        fVar90 = auVar73._20_4_;
        auVar89._20_4_ = fVar90;
        fVar80 = auVar73._24_4_;
        auVar89._24_4_ = fVar80;
        uVar46 = auVar73._28_4_;
        auVar89._28_4_ = uVar46;
        uVar11 = vcmpps_avx512vl(auVar89,auVar126._0_32_,5);
        bVar44 = bVar44 & (byte)uVar11;
        if (bVar44 != 0) {
          vandps_avx512vl(ZEXT1632(auVar51),auVar122._0_32_);
          auVar54 = vsubps_avx(auVar55,auVar55);
          uVar11 = vcmpps_avx512vl(auVar54,auVar89,5);
          bVar44 = bVar44 & (byte)uVar11;
          if (bVar44 != 0) {
            auVar22._4_4_ = auVar65._4_4_ * auVar104._4_4_;
            auVar22._0_4_ = auVar65._0_4_ * auVar104._0_4_;
            auVar22._8_4_ = auVar65._8_4_ * auVar104._8_4_;
            auVar22._12_4_ = auVar65._12_4_ * auVar104._12_4_;
            auVar22._16_4_ = auVar65._16_4_ * 0.0;
            auVar22._20_4_ = auVar65._20_4_ * 0.0;
            auVar22._24_4_ = auVar65._24_4_ * 0.0;
            auVar22._28_4_ = auVar65._28_4_;
            auVar16 = vfmadd213ps_fma(auVar64,(undefined1  [32])vVar72.field_0,auVar22);
            auVar16 = vfmadd213ps_fma(auVar63,ZEXT1632(auVar52),ZEXT1632(auVar16));
            fVar76 = auVar55._0_4_;
            auVar106._0_4_ = fVar76 * *(float *)(ray + 0x60);
            fVar92 = auVar55._4_4_;
            auVar106._4_4_ = fVar92 * *(float *)(ray + 100);
            fVar94 = auVar55._8_4_;
            auVar106._8_4_ = fVar94 * *(float *)(ray + 0x68);
            fVar96 = auVar55._12_4_;
            auVar106._12_4_ = fVar96 * *(float *)(ray + 0x6c);
            fVar98 = auVar55._16_4_;
            auVar106._16_4_ = fVar98 * *(float *)(ray + 0x70);
            fVar99 = auVar55._20_4_;
            auVar106._20_4_ = fVar99 * *(float *)(ray + 0x74);
            fVar100 = auVar55._24_4_;
            auVar106._24_4_ = fVar100 * *(float *)(ray + 0x78);
            auVar106._28_4_ = 0;
            auVar103._0_4_ = (float)(auVar73._0_4_ ^ auVar16._0_4_);
            auVar103._4_4_ = (float)(auVar73._4_4_ ^ auVar16._4_4_);
            auVar103._8_4_ = (float)(auVar73._8_4_ ^ auVar16._8_4_);
            auVar103._12_4_ = (float)(auVar73._12_4_ ^ auVar16._12_4_);
            auVar103._16_4_ = fVar75;
            auVar103._20_4_ = fVar90;
            auVar103._24_4_ = fVar80;
            auVar103._28_4_ = uVar46;
            auVar23._4_4_ = fVar92 * *(float *)(ray + 0x104);
            auVar23._0_4_ = fVar76 * *(float *)(ray + 0x100);
            auVar23._8_4_ = fVar94 * *(float *)(ray + 0x108);
            auVar23._12_4_ = fVar96 * *(float *)(ray + 0x10c);
            auVar23._16_4_ = fVar98 * *(float *)(ray + 0x110);
            auVar23._20_4_ = fVar99 * *(float *)(ray + 0x114);
            auVar23._24_4_ = fVar100 * *(float *)(ray + 0x118);
            auVar23._28_4_ = auVar65._28_4_;
            uVar11 = vcmpps_avx512vl(auVar103,auVar23,2);
            uVar12 = vcmpps_avx512vl(auVar106,auVar103,1);
            local_2c00[0] = bVar44 & (byte)uVar11 & (byte)uVar12;
            local_2c00._1_3_ = 0;
            stack0xffffffffffffd404 = auVar53._4_28_;
            if (local_2c00[0] != 0) {
              uVar11 = vcmpps_avx512vl(ZEXT1632(auVar51),ZEXT832(0) << 0x20,4);
              local_2c00[0] = local_2c00[0] & (byte)uVar11;
              local_2c00._1_3_ = 0;
              if (local_2c00[0] != 0) {
                uVar49 = CONCAT44(0,*(uint *)(lVar41 + lVar43 * 4));
                local_2bc0._0_8_ = uVar49;
                pGVar1 = (context->scene->geometries).items[uVar49].ptr;
                uVar48 = pGVar1->mask;
                auVar107._4_4_ = uVar48;
                auVar107._0_4_ = uVar48;
                auVar107._8_4_ = uVar48;
                auVar107._12_4_ = uVar48;
                auVar107._16_4_ = uVar48;
                auVar107._20_4_ = uVar48;
                auVar107._24_4_ = uVar48;
                auVar107._28_4_ = uVar48;
                uVar11 = vptestmd_avx512vl(auVar107,*(undefined1 (*) [32])(ray + 0x120));
                local_2c00[0] = local_2c00[0] & (byte)uVar11;
                local_2c00._1_3_ = 0;
                if (local_2c00[0] != 0) {
                  local_2b60._0_4_ = *(undefined4 *)((long)&local_2b30 + lVar43 * 4);
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar1->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar53 = vrcp14ps_avx512vl(auVar55);
                    auVar111._8_4_ = 0x3f800000;
                    auVar111._0_8_ = 0x3f8000003f800000;
                    auVar111._12_4_ = 0x3f800000;
                    auVar111._16_4_ = 0x3f800000;
                    auVar111._20_4_ = 0x3f800000;
                    auVar111._24_4_ = 0x3f800000;
                    auVar111._28_4_ = 0x3f800000;
                    auVar51 = vfnmadd213ps_fma(auVar55,auVar53,auVar111);
                    auVar51 = vfmadd132ps_fma(ZEXT1632(auVar51),auVar53,auVar53);
                    fVar91 = auVar51._0_4_;
                    fVar93 = auVar51._4_4_;
                    local_2960._4_4_ = fVar93 * auVar103._4_4_;
                    local_2960._0_4_ = fVar91 * auVar103._0_4_;
                    fVar95 = auVar51._8_4_;
                    fStack_2958 = fVar95 * auVar103._8_4_;
                    fVar97 = auVar51._12_4_;
                    fStack_2954 = fVar97 * auVar103._12_4_;
                    fStack_2950 = fVar75 * 0.0;
                    fStack_294c = fVar90 * 0.0;
                    fStack_2948 = fVar80 * 0.0;
                    uStack_2944 = uVar46;
                    auVar24._4_4_ = fVar93 * fVar92;
                    auVar24._0_4_ = fVar91 * fVar76;
                    auVar24._8_4_ = fVar95 * fVar94;
                    auVar24._12_4_ = fVar97 * fVar96;
                    auVar24._16_4_ = fVar98 * 0.0;
                    auVar24._20_4_ = fVar99 * 0.0;
                    auVar24._24_4_ = fVar100 * 0.0;
                    auVar24._28_4_ = auVar55._28_4_;
                    auVar53 = vminps_avx(auVar24,auVar111);
                    auVar25._4_4_ = fVar93 * auVar89._4_4_;
                    auVar25._0_4_ = fVar91 * auVar89._0_4_;
                    auVar25._8_4_ = fVar95 * auVar89._8_4_;
                    auVar25._12_4_ = fVar97 * auVar89._12_4_;
                    auVar25._16_4_ = fVar75 * 0.0;
                    auVar25._20_4_ = fVar90 * 0.0;
                    auVar25._24_4_ = fVar80 * 0.0;
                    auVar25._28_4_ = uVar46;
                    auVar55 = vminps_avx(auVar25,auVar111);
                    local_2920 = vsubps_avx(auVar111,auVar53);
                    local_2940 = vsubps_avx(auVar111,auVar55);
                    local_29c0.field_0.x.field_0 = (vfloat_impl<8>)ZEXT1632(auVar52);
                    local_29c0.field_0.z.field_0 = (vfloat_impl<8>)ZEXT1632(auVar104);
                    local_2c50.valid = local_28a0;
                    local_2c50.geometryUserPtr = &local_2a20;
                    local_2c50.context = local_2a00;
                    local_2c50.ray = local_29e0;
                    in_ZMM12 = ZEXT1664(auVar108);
                    in_ZMM13 = ZEXT1664(auVar15);
                    in_ZMM14 = ZEXT1664(auVar60._0_16_);
                    local_29c0.field_0.y.field_0 = (vfloat_impl<8>)(undefined1  [32])vVar72.field_0;
                    std::
                    _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
                    ::
                    _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                              ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                                *)&local_2c50,
                               (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                                *)&local_29c0.field_0);
                    pRVar2 = context->user;
                    local_2900 = vpbroadcastd_avx512vl();
                    local_2920 = vpbroadcastd_avx512vl();
                    local_29c0.field_0.y.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_2880;
                    local_29c0.field_0.z.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_2860;
                    auVar53 = vpcmpeqd_avx2(local_2900,local_2900);
                    local_2bc8[1] = auVar53;
                    *local_2bc8 = auVar53;
                    local_28e0 = pRVar2->instID[0];
                    uStack_28dc = local_28e0;
                    uStack_28d8 = local_28e0;
                    uStack_28d4 = local_28e0;
                    uStack_28d0 = local_28e0;
                    uStack_28cc = local_28e0;
                    uStack_28c8 = local_28e0;
                    uStack_28c4 = local_28e0;
                    local_28c0 = pRVar2->instPrimID[0];
                    uStack_28bc = local_28c0;
                    uStack_28b8 = local_28c0;
                    uStack_28b4 = local_28c0;
                    uStack_28b0 = local_28c0;
                    uStack_28ac = local_28c0;
                    uStack_28a8 = local_28c0;
                    uStack_28a4 = local_28c0;
                    local_2bc0 = *(undefined1 (*) [32])(ray + 0x100);
                    auVar53 = vblendmps_avx512vl(local_2bc0,(undefined1  [32])local_2a20);
                    bVar38 = (bool)(local_2c00[0] & 1);
                    bVar4 = (bool)((byte)((uint)local_2c00._0_4_ >> 1) & 1);
                    bVar5 = (bool)((byte)((uint)local_2c00._0_4_ >> 2) & 1);
                    bVar6 = (bool)((byte)((uint)local_2c00._0_4_ >> 3) & 1);
                    bVar7 = (bool)((byte)((uint)local_2c00._0_4_ >> 4) & 1);
                    bVar8 = (bool)((byte)((uint)local_2c00._0_4_ >> 5) & 1);
                    bVar9 = (bool)((byte)((uint)local_2c00._0_4_ >> 6) & 1);
                    bVar10 = (bool)((byte)((uint)local_2c00._0_4_ >> 7) & 1);
                    *(uint *)(ray + 0x100) =
                         (uint)bVar38 * auVar53._0_4_ | (uint)!bVar38 * local_2bc0._0_4_;
                    *(uint *)(ray + 0x104) =
                         (uint)bVar4 * auVar53._4_4_ | (uint)!bVar4 * local_2bc0._4_4_;
                    *(uint *)(ray + 0x108) =
                         (uint)bVar5 * auVar53._8_4_ | (uint)!bVar5 * local_2bc0._8_4_;
                    *(uint *)(ray + 0x10c) =
                         (uint)bVar6 * auVar53._12_4_ | (uint)!bVar6 * local_2bc0._12_4_;
                    *(uint *)(ray + 0x110) =
                         (uint)bVar7 * auVar53._16_4_ | (uint)!bVar7 * local_2bc0._16_4_;
                    *(uint *)(ray + 0x114) =
                         (uint)bVar8 * auVar53._20_4_ | (uint)!bVar8 * local_2bc0._20_4_;
                    *(uint *)(ray + 0x118) =
                         (uint)bVar9 * auVar53._24_4_ | (uint)!bVar9 * local_2bc0._24_4_;
                    *(uint *)(ray + 0x11c) =
                         (uint)bVar10 * auVar53._28_4_ | (uint)!bVar10 * local_2bc0._28_4_;
                    local_2ba0 = vpmovm2d_avx512vl((ulong)(uint)local_2c00._0_4_);
                    local_2c50.valid = (int *)local_2ba0;
                    local_2c50.geometryUserPtr = pGVar1->userPtr;
                    local_2c50.context = context->user;
                    local_2c50.hit = (RTCHitN *)&local_29c0;
                    local_2c50.N = 8;
                    local_2c50.ray = (RTCRayN *)ray;
                    if (pGVar1->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                      in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                      in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                      (*pGVar1->occlusionFilterN)(&local_2c50);
                    }
                    if (local_2ba0 == (undefined1  [32])0x0) {
                      auVar35._28_4_ = 0;
                      auVar35._0_28_ = stack0xffffffffffffd404;
                      _local_2c00 = auVar35 << 0x20;
                    }
                    else {
                      p_Var3 = context->args->filter;
                      if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar1->field_8).field_0x2 & 0x40) != 0)))) {
                        in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                        in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                        in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                        (*p_Var3)(&local_2c50);
                      }
                      uVar49 = vptestmd_avx512vl(local_2ba0,local_2ba0);
                      iVar39 = *(int *)((RayK<8> *)(local_2c50.ray + 0x100) + 4);
                      iVar26 = *(int *)((RayK<8> *)(local_2c50.ray + 0x100) + 8);
                      iVar27 = *(int *)((RayK<8> *)(local_2c50.ray + 0x100) + 0xc);
                      iVar28 = *(int *)((RayK<8> *)(local_2c50.ray + 0x100) + 0x10);
                      iVar29 = *(int *)((RayK<8> *)(local_2c50.ray + 0x100) + 0x14);
                      iVar30 = *(int *)((RayK<8> *)(local_2c50.ray + 0x100) + 0x18);
                      iVar31 = *(int *)((RayK<8> *)(local_2c50.ray + 0x100) + 0x1c);
                      auVar53 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar38 = (bool)((byte)uVar49 & 1);
                      bVar4 = (bool)((byte)(uVar49 >> 1) & 1);
                      bVar5 = (bool)((byte)(uVar49 >> 2) & 1);
                      bVar6 = (bool)((byte)(uVar49 >> 3) & 1);
                      bVar7 = (bool)((byte)(uVar49 >> 4) & 1);
                      bVar8 = (bool)((byte)(uVar49 >> 5) & 1);
                      bVar9 = (bool)((byte)(uVar49 >> 6) & 1);
                      bVar10 = SUB81(uVar49 >> 7,0);
                      local_2c00._0_4_ = (int)uVar49;
                      *(uint *)(local_2c50.ray + 0x100) =
                           (uint)bVar38 * auVar53._0_4_ |
                           (uint)!bVar38 * *(int *)(local_2c50.ray + 0x100);
                      *(uint *)((RayK<8> *)(local_2c50.ray + 0x100) + 4) =
                           (uint)bVar4 * auVar53._4_4_ | (uint)!bVar4 * iVar39;
                      *(uint *)((RayK<8> *)(local_2c50.ray + 0x100) + 8) =
                           (uint)bVar5 * auVar53._8_4_ | (uint)!bVar5 * iVar26;
                      *(uint *)((RayK<8> *)(local_2c50.ray + 0x100) + 0xc) =
                           (uint)bVar6 * auVar53._12_4_ | (uint)!bVar6 * iVar27;
                      *(uint *)((RayK<8> *)(local_2c50.ray + 0x100) + 0x10) =
                           (uint)bVar7 * auVar53._16_4_ | (uint)!bVar7 * iVar28;
                      *(uint *)((RayK<8> *)(local_2c50.ray + 0x100) + 0x14) =
                           (uint)bVar8 * auVar53._20_4_ | (uint)!bVar8 * iVar29;
                      *(uint *)((RayK<8> *)(local_2c50.ray + 0x100) + 0x18) =
                           (uint)bVar9 * auVar53._24_4_ | (uint)!bVar9 * iVar30;
                      *(uint *)((RayK<8> *)(local_2c50.ray + 0x100) + 0x1c) =
                           (uint)bVar10 * auVar53._28_4_ | (uint)!bVar10 * iVar31;
                    }
                    bVar38 = (bool)(local_2c00[0] & 1);
                    auVar74._0_4_ =
                         (uint)bVar38 * *(int *)local_2c18 | (uint)!bVar38 * local_2bc0._0_4_;
                    bVar38 = (bool)((byte)((uint)local_2c00._0_4_ >> 1) & 1);
                    auVar74._4_4_ =
                         (uint)bVar38 * *(int *)(local_2c18 + 4) | (uint)!bVar38 * local_2bc0._4_4_;
                    bVar38 = (bool)((byte)((uint)local_2c00._0_4_ >> 2) & 1);
                    auVar74._8_4_ =
                         (uint)bVar38 * *(int *)(local_2c18 + 8) | (uint)!bVar38 * local_2bc0._8_4_;
                    bVar38 = (bool)((byte)((uint)local_2c00._0_4_ >> 3) & 1);
                    auVar74._12_4_ =
                         (uint)bVar38 * *(int *)(local_2c18 + 0xc) |
                         (uint)!bVar38 * local_2bc0._12_4_;
                    bVar38 = (bool)((byte)((uint)local_2c00._0_4_ >> 4) & 1);
                    auVar74._16_4_ =
                         (uint)bVar38 * *(int *)(local_2c18 + 0x10) |
                         (uint)!bVar38 * local_2bc0._16_4_;
                    bVar38 = (bool)((byte)((uint)local_2c00._0_4_ >> 5) & 1);
                    auVar74._20_4_ =
                         (uint)bVar38 * *(int *)(local_2c18 + 0x14) |
                         (uint)!bVar38 * local_2bc0._20_4_;
                    bVar38 = (bool)((byte)((uint)local_2c00._0_4_ >> 6) & 1);
                    auVar74._24_4_ =
                         (uint)bVar38 * *(int *)(local_2c18 + 0x18) |
                         (uint)!bVar38 * local_2bc0._24_4_;
                    bVar38 = (bool)((byte)((uint)local_2c00._0_4_ >> 7) & 1);
                    auVar74._28_4_ =
                         (uint)bVar38 * *(int *)(local_2c18 + 0x1c) |
                         (uint)!bVar38 * local_2bc0._28_4_;
                    *(undefined1 (*) [32])local_2c18 = auVar74;
                  }
                  bVar37 = bVar37 & ~local_2c00[0];
                }
              }
            }
            auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar122 = ZEXT3264(auVar53);
            auVar53 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar123 = ZEXT3264(auVar53);
            auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar124 = ZEXT3264(auVar53);
            auVar53 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar125 = ZEXT3264(auVar53);
            auVar50 = vxorps_avx512vl(auVar50,auVar50);
            auVar126 = ZEXT1664(auVar50);
          }
        }
      }
      lVar43 = lVar43 + 1;
    } while (bVar37 != 0);
    bVar37 = 0;
LAB_01d03bff:
    lVar40 = lVar40 + 1;
    lVar41 = lVar41 + 0xe0;
    bVar42 = bVar42 & bVar37;
  } while (bVar42 != 0);
  bVar42 = 0;
LAB_01d03c14:
  auVar53 = auVar123._0_32_;
  bVar42 = (byte)local_2c8c | ~bVar42;
  local_2c8c = (uint)bVar42;
  if (bVar42 == 0xff) {
    local_2c8c._0_1_ = 0xff;
    goto LAB_01d03d61;
  }
  auVar53 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  bVar38 = (bool)(bVar42 >> 1 & 1);
  bVar4 = (bool)(bVar42 >> 2 & 1);
  bVar5 = (bool)(bVar42 >> 3 & 1);
  bVar6 = (bool)(bVar42 >> 4 & 1);
  bVar7 = (bool)(bVar42 >> 5 & 1);
  bVar8 = (bool)(bVar42 >> 6 & 1);
  local_2640._4_4_ = (uint)bVar38 * auVar53._4_4_ | (uint)!bVar38 * local_2640._4_4_;
  local_2640._0_4_ =
       (uint)(bVar42 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar42 & 1) * local_2640._0_4_;
  local_2640._8_4_ = (uint)bVar4 * auVar53._8_4_ | (uint)!bVar4 * local_2640._8_4_;
  local_2640._12_4_ = (uint)bVar5 * auVar53._12_4_ | (uint)!bVar5 * local_2640._12_4_;
  local_2640._16_4_ = (uint)bVar6 * auVar53._16_4_ | (uint)!bVar6 * local_2640._16_4_;
  local_2640._20_4_ = (uint)bVar7 * auVar53._20_4_ | (uint)!bVar7 * local_2640._20_4_;
  local_2640._24_4_ = (uint)bVar8 * auVar53._24_4_ | (uint)!bVar8 * local_2640._24_4_;
  local_2640._28_4_ =
       (uint)(bVar42 >> 7) * auVar53._28_4_ | (uint)!(bool)(bVar42 >> 7) * local_2640._28_4_;
  goto LAB_01d02df5;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }